

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::StringParameter::ByteSizeLong(StringParameter *this)

{
  string *value;
  size_t sVar1;
  
  value = (this->defaultvalue_).ptr_;
  if (value->_M_string_length == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = google::protobuf::internal::WireFormatLite::StringSize(value);
    sVar1 = sVar1 + 1;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t StringParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.StringParameter)
  size_t total_size = 0;

  // string defaultValue = 1;
  if (this->defaultvalue().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->defaultvalue());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}